

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_setfield(lua_State *L,int idx,char *k)

{
  StkId pTVar1;
  TValue *key;
  TValue *t;
  TString *pTVar2;
  
  t = index2addr(L,idx);
  pTVar1 = L->top;
  pTVar2 = luaS_new(L,k);
  (pTVar1->value_).gc = (GCObject *)pTVar2;
  pTVar1->tt_ = pTVar2->tt | 0x40;
  key = L->top;
  L->top = key + 1;
  luaV_settable(L,t,key,key + -1);
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_setfield (lua_State *L, int idx, const char *k) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  setsvalue2s(L, L->top, luaS_new(L, k));
  api_incr_top(L);
  luaV_settable(L, t, L->top - 1, L->top - 2);
  L->top -= 2;  /* pop value and key */
  lua_unlock(L);
}